

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O1

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::exists
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *low,Vector2<long> *high)

{
  Node *pNVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  level_nodes;
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  local_88;
  
  if (this->root == (Node *)0x0) {
    bVar5 = false;
  }
  else {
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    ::std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::_M_initialize_map(&local_88,0);
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)&local_88,&this->root);
    bVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (bVar5) {
      do {
        pNVar1 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_88._M_impl.super__Deque_impl_data._M_start._M_last =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_88._M_impl.super__Deque_impl_data._M_start._M_first =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_88._M_impl.super__Deque_impl_data._M_start._M_node =
               local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        lVar4 = 0;
        do {
          lVar2 = (&(pNVar1->pt).field_0)[lVar4].x;
          if ((lVar2 < (&low->field_0)[lVar4].x) || ((&high->field_0)[lVar4].x <= lVar2))
          goto LAB_00107c0e;
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        lVar4 = 2;
LAB_00107c0e:
        if (lVar4 == 2) break;
        sVar3 = pNVar1->dim;
        lVar4 = (&(pNVar1->pt).field_0)[sVar3].x;
        lVar2 = (&high->field_0)[sVar3].x;
        if (((&low->field_0)[sVar3].x < lVar4) && (pNVar1->before != (Node *)0x0)) {
          ::std::
          deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
          ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                    ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                      *)&local_88,&pNVar1->before);
        }
        if ((lVar4 <= lVar2) && (pNVar1->after_or_equal != (Node *)0x0)) {
          ::std::
          deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
          ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                    ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                      *)&local_88,&pNVar1->after_or_equal);
        }
        bVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (bVar5);
    }
    ::std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::~_Deque_base(&local_88);
  }
  return bVar5;
}

Assistant:

bool KDTree<CoordType, ValueType>::exists(const CoordType& low,
    const CoordType& high) const {
  if (this->root == nullptr) {
    return false;
  }

  std::deque<Node*> level_nodes;
  level_nodes.emplace_back(this->root);
  while (!level_nodes.empty()) {
    Node* n = level_nodes.front();
    level_nodes.pop_front();

    // if this node is within the range, return it
    {
      size_t dim;
      for (dim = 0; dim < CoordType::dimensions(); dim++) {
        if ((n->pt.at(dim) < low.at(dim)) ||
            (n->pt.at(dim) >= high.at(dim))) {
          break;
        }
      }
      if (dim == CoordType::dimensions()) {
        return true;
      }
    }

    // if the range falls entirely on one side of the node, move down to that
    // node. otherwise, move down to both nodes
    bool low_less = (low.at(n->dim) < n->pt.at(n->dim));
    bool high_greater = (high.at(n->dim) >= n->pt.at(n->dim));
    if (low_less && n->before) {
      level_nodes.emplace_back(n->before);
    }
    if (high_greater && n->after_or_equal) {
      level_nodes.emplace_back(n->after_or_equal);
    }
  }
  return false;
}